

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5VocabOpenMethod(sqlite3_vtab *pVTab,sqlite3_vtab_cursor **ppCsr)

{
  int iVar1;
  char *zSql_00;
  sqlite3_int64 iCsrId;
  sqlite3_vtab_cursor *psVar2;
  int nByte;
  i64 iId;
  char *zSql;
  sqlite3_stmt *pStmt;
  sqlite3_module *psStack_30;
  int rc;
  Fts5VocabCursor *pCsr;
  Fts5Table *pFts5;
  Fts5VocabTable *pTab;
  sqlite3_vtab_cursor **ppCsr_local;
  sqlite3_vtab *pVTab_local;
  
  pCsr = (Fts5VocabCursor *)0x0;
  psStack_30 = (sqlite3_module *)0x0;
  pStmt._4_4_ = 0;
  zSql = (char *)0x0;
  pFts5 = (Fts5Table *)pVTab;
  pTab = (Fts5VocabTable *)ppCsr;
  ppCsr_local = (sqlite3_vtab_cursor **)pVTab;
  zSql_00 = sqlite3Fts5Mprintf((int *)((long)&pStmt + 4),
                               "SELECT t.%Q FROM %Q.%Q AS t WHERE t.%Q MATCH \'*id\'",
                               pVTab[1].pModule,*(undefined8 *)&pVTab[1].nRef,pVTab[1].pModule,
                               pVTab[1].pModule);
  if (zSql_00 != (char *)0x0) {
    pStmt._4_4_ = sqlite3_prepare_v2((sqlite3 *)pFts5[1].base.pModule,zSql_00,-1,
                                     (sqlite3_stmt **)&zSql,(char **)0x0);
  }
  sqlite3_free(zSql_00);
  if (pStmt._4_4_ == 1) {
    pStmt._4_4_ = 0;
  }
  if ((zSql != (char *)0x0) && (iVar1 = sqlite3_step((sqlite3_stmt *)zSql), iVar1 == 100)) {
    iCsrId = sqlite3_column_int64((sqlite3_stmt *)zSql,0);
    pCsr = (Fts5VocabCursor *)sqlite3Fts5TableFromCsrid(*(Fts5Global **)&pFts5[1].base.nRef,iCsrId);
  }
  if (pStmt._4_4_ == 0) {
    if (pCsr == (Fts5VocabCursor *)0x0) {
      pStmt._4_4_ = sqlite3_finalize((sqlite3_stmt *)zSql);
      zSql = (char *)0x0;
      if (pStmt._4_4_ == 0) {
        psVar2 = (sqlite3_vtab_cursor *)
                 sqlite3_mprintf("no such fts5 table: %s.%s",pFts5->pIndex,pFts5->pConfig);
        ppCsr_local[2] = psVar2;
        pStmt._4_4_ = 1;
      }
    }
    else {
      pStmt._4_4_ = sqlite3Fts5FlushToDisk((Fts5Table *)pCsr);
    }
  }
  if (pStmt._4_4_ == 0) {
    psStack_30 = (sqlite3_module *)
                 sqlite3Fts5MallocZero
                           ((int *)((long)&pStmt + 4),
                            (long)(*(int *)(*(long *)&pCsr->bEof + 0x18) * 0x10 + 0x78));
  }
  if (psStack_30 == (sqlite3_module *)0x0) {
    sqlite3_finalize((sqlite3_stmt *)zSql);
  }
  else {
    psStack_30->xConnect =
         (_func_int_sqlite3_ptr_void_ptr_int_char_ptr_ptr_sqlite3_vtab_ptr_ptr_char_ptr_ptr *)pCsr;
    psStack_30->xCreate =
         (_func_int_sqlite3_ptr_void_ptr_int_char_ptr_ptr_sqlite3_vtab_ptr_ptr_char_ptr_ptr *)zSql;
    psStack_30->xFilter =
         (_func_int_sqlite3_vtab_cursor_ptr_int_char_ptr_int_sqlite3_value_ptr_ptr *)
         &psStack_30->xSync;
    psStack_30->xNext =
         (_func_int_sqlite3_vtab_cursor_ptr *)
         (psStack_30->xFilter + (long)*(int *)(*(long *)&pCsr->bEof + 0x18) * 8);
  }
  (pTab->base).pModule = psStack_30;
  return pStmt._4_4_;
}

Assistant:

static int fts5VocabOpenMethod(
  sqlite3_vtab *pVTab, 
  sqlite3_vtab_cursor **ppCsr
){
  Fts5VocabTable *pTab = (Fts5VocabTable*)pVTab;
  Fts5Table *pFts5 = 0;
  Fts5VocabCursor *pCsr = 0;
  int rc = SQLITE_OK;
  sqlite3_stmt *pStmt = 0;
  char *zSql = 0;

  zSql = sqlite3Fts5Mprintf(&rc,
      "SELECT t.%Q FROM %Q.%Q AS t WHERE t.%Q MATCH '*id'",
      pTab->zFts5Tbl, pTab->zFts5Db, pTab->zFts5Tbl, pTab->zFts5Tbl
  );
  if( zSql ){
    rc = sqlite3_prepare_v2(pTab->db, zSql, -1, &pStmt, 0);
  }
  sqlite3_free(zSql);
  assert( rc==SQLITE_OK || pStmt==0 );
  if( rc==SQLITE_ERROR ) rc = SQLITE_OK;

  if( pStmt && sqlite3_step(pStmt)==SQLITE_ROW ){
    i64 iId = sqlite3_column_int64(pStmt, 0);
    pFts5 = sqlite3Fts5TableFromCsrid(pTab->pGlobal, iId);
  }

  if( rc==SQLITE_OK ){
    if( pFts5==0 ){
      rc = sqlite3_finalize(pStmt);
      pStmt = 0;
      if( rc==SQLITE_OK ){
        pVTab->zErrMsg = sqlite3_mprintf(
            "no such fts5 table: %s.%s", pTab->zFts5Db, pTab->zFts5Tbl
            );
        rc = SQLITE_ERROR;
      }
    }else{
      rc = sqlite3Fts5FlushToDisk(pFts5);
    }
  }

  if( rc==SQLITE_OK ){
    int nByte = pFts5->pConfig->nCol * sizeof(i64)*2 + sizeof(Fts5VocabCursor);
    pCsr = (Fts5VocabCursor*)sqlite3Fts5MallocZero(&rc, nByte);
  }

  if( pCsr ){
    pCsr->pFts5 = pFts5;
    pCsr->pStmt = pStmt;
    pCsr->aCnt = (i64*)&pCsr[1];
    pCsr->aDoc = &pCsr->aCnt[pFts5->pConfig->nCol];
  }else{
    sqlite3_finalize(pStmt);
  }

  *ppCsr = (sqlite3_vtab_cursor*)pCsr;
  return rc;
}